

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void str_utf8_copy_num(char *dst,char *src,int dst_size,int num)

{
  bool bVar1;
  int cursor;
  int iVar2;
  
  if (dst_size < 1) {
    dbg_msg("assert","%s(%d): %s",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/system.c"
            ,0xadf,"dst_size invalid");
    _DAT_00000000 = 0;
  }
  cursor = 0;
  if (0 < num && *src != '\0') {
    cursor = 0;
    do {
      iVar2 = str_utf8_forward(src,cursor);
      if ((dst_size <= iVar2) || (cursor = iVar2, src[iVar2] == '\0')) break;
      bVar1 = 1 < num;
      num = num + -1;
    } while (bVar1);
  }
  iVar2 = cursor + 1;
  if (dst_size <= cursor) {
    iVar2 = dst_size;
  }
  str_copy(dst,src,iVar2);
  return;
}

Assistant:

void str_utf8_copy_num(char *dst, const char *src, int dst_size, int num)
{
	int new_cursor;
	int cursor = 0;
	dbg_assert(dst_size > 0, "dst_size invalid");

	while(src[cursor] && num > 0)
	{
		new_cursor = str_utf8_forward(src, cursor);
		if(new_cursor >= dst_size)			// reserve 1 byte for the null termination
			break;
		else
			cursor = new_cursor;
		--num;
	}

	str_copy(dst, src, cursor < dst_size ? cursor+1 : dst_size);
}